

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerializeMessageTo<google::protobuf::internal::ArrayOutput>
          (internal *this,MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  _func_int **pp_Var1;
  uint32 length;
  int32 cached_size;
  
  cached_size = (int32)output;
  if (msg != (MessageLite *)0x0) {
    pp_Var1 = msg[1]._vptr_MessageLite;
    WriteLengthTo<google::protobuf::internal::ArrayOutput>
              (*(uint32 *)(this + *(uint *)pp_Var1),(ArrayOutput *)table_ptr);
    SerializeMessageDispatch
              ((MessageLite *)this,(FieldMetadata *)(pp_Var1 + 3),
               *(int *)&msg->_vptr_MessageLite + -1,cached_size,(ArrayOutput *)table_ptr);
    return;
  }
  length = (**(code **)(*(long *)this + 0x60))(this);
  WriteLengthTo<google::protobuf::internal::ArrayOutput>(length,(ArrayOutput *)table_ptr);
  SerializeMessageNoTable((MessageLite *)this,(ArrayOutput *)table_ptr);
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}